

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory64Lowering.cpp
# Opt level: O3

void __thiscall
wasm::Memory64Lowering::extendAddress64
          (Memory64Lowering *this,Expression **ptr,Name memoryOrTableName,bool isTable)

{
  Module *this_00;
  uintptr_t uVar1;
  Expression *pEVar2;
  Table *pTVar3;
  Memory *pMVar4;
  Unary *this_01;
  
  if (((*ptr)->type).id != 1) {
    this_00 = (this->
              super_WalkerPass<wasm::PostWalker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>_>
              ).
              super_PostWalker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>
              .super_Walker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>.
              currModule;
    if (isTable) {
      pTVar3 = Module::getTable(this_00,memoryOrTableName);
      uVar1 = (pTVar3->addressType).id;
    }
    else {
      pMVar4 = Module::getMemory(this_00,memoryOrTableName);
      uVar1 = (pMVar4->addressType).id;
    }
    if (uVar1 == 3) {
      pEVar2 = *ptr;
      if ((pEVar2->type).id != 3) {
        __assert_fail("ptr->type == Type::i64",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Memory64Lowering.cpp"
                      ,0x48,
                      "void wasm::Memory64Lowering::extendAddress64(Expression *&, Name, bool)");
      }
      (pEVar2->type).id = 2;
      this_01 = (Unary *)MixedArena::allocSpace(&this_00->allocator,0x20,8);
      (this_01->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
      (this_01->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
      this_01->op = ExtendUInt32;
      this_01->value = pEVar2;
      Unary::finalize(this_01);
      *ptr = (Expression *)this_01;
    }
  }
  return;
}

Assistant:

void extendAddress64(Expression*& ptr,
                       Name memoryOrTableName,
                       bool isTable = false) {
    if (ptr->type == Type::unreachable) {
      return;
    }
    auto& module = *getModule();
    bool is64 = false;
    if (isTable) {
      is64 = module.getTable(memoryOrTableName)->is64();
    } else {
      is64 = module.getMemory(memoryOrTableName)->is64();
    }
    if (is64) {
      assert(ptr->type == Type::i64);
      ptr->type = Type::i32;
      ptr = Builder(module).makeUnary(UnaryOp::ExtendUInt32, ptr);
    }
  }